

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  ImRect *local_40;
  ImGuiID local_34;
  ImGuiID id;
  ImRect *display_rect;
  ImGuiWindow *hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    g._7_1_ = false;
  }
  else {
    this = GImGui->CurrentWindow;
    if (((GImGui->LastItemData).StatusFlags & 1U) == 0) {
      g._7_1_ = false;
    }
    else if (((GImGui->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) ||
             (this->RootWindowDockTree != GImGui->HoveredWindowUnderMovingWindow->RootWindowDockTree
             )) || ((this->SkipItems & 1U) != 0)) {
      g._7_1_ = false;
    }
    else {
      if (((GImGui->LastItemData).StatusFlags & 2U) == 0) {
        local_40 = &(GImGui->LastItemData).Rect;
      }
      else {
        local_40 = &(GImGui->LastItemData).DisplayRect;
      }
      local_34 = (GImGui->LastItemData).ID;
      if (local_34 == 0) {
        local_34 = ImGuiWindow::GetIDFromRectangle(this,local_40);
      }
      if ((pIVar1->DragDropPayload).SourceId == local_34) {
        g._7_1_ = false;
      }
      else {
        if ((pIVar1->DragDropWithinTarget & 1U) != 0) {
          __assert_fail("g.DragDropWithinTarget == false",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,10999,"bool ImGui::BeginDragDropTarget()");
        }
        (pIVar1->DragDropTargetRect).Min = local_40->Min;
        (pIVar1->DragDropTargetRect).Max = local_40->Max;
        pIVar1->DragDropTargetId = local_34;
        pIVar1->DragDropWithinTarget = true;
        g._7_1_ = true;
      }
    }
  }
  return g._7_1_;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindowDockTree != hovered_window->RootWindowDockTree || window->SkipItems)
        return false;

    const ImRect& display_rect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? g.LastItemData.DisplayRect : g.LastItemData.Rect;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}